

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O2

void free_cached_groups(void)

{
  R3410_ec_params *pRVar1;
  
  for (pRVar1 = R3410_2012_512_paramset; pRVar1->nid != 0; pRVar1 = pRVar1 + 1) {
    EC_GROUP_free((EC_GROUP *)pRVar1->group);
    pRVar1->group = (EC_GROUP *)0x0;
  }
  for (pRVar1 = R3410_2001_paramset; pRVar1->nid != 0; pRVar1 = pRVar1 + 1) {
    EC_GROUP_free((EC_GROUP *)pRVar1->group);
    pRVar1->group = (EC_GROUP *)0x0;
  }
  return;
}

Assistant:

void free_cached_groups()
{
    R3410_ec_params *params;

    /* Search nid in 2012 paramset */
    params = R3410_2012_512_paramset;
    while (params->nid != NID_undef) {
	EC_GROUP_free(params->group);
	params->group = NULL;
        params++;
    }

    /* Search nid in 2001 paramset */
    params = R3410_2001_paramset;
    while (params->nid != NID_undef) {
	EC_GROUP_free(params->group);
	params->group = NULL;
        params++;
    }
}